

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_helpers.cpp
# Opt level: O1

vector<unsigned_long,_true> *
duckdb::ParseColumnsOrdered
          (vector<unsigned_long,_true> *__return_storage_ptr__,Value *value,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names,string *loption)

{
  LogicalTypeId LVar1;
  pointer pcVar2;
  undefined1 auVar3 [16];
  int iVar4;
  vector<duckdb::Value,_true> *this;
  const_reference pvVar5;
  BinderException *this_00;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  vector<unsigned_long,_true> result;
  undefined1 local_a8 [16];
  pointer local_98;
  string local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  long lVar14;
  
  local_a8 = (undefined1  [16])0x0;
  local_98 = (pointer)0x0;
  LVar1 = (value->type_).id_;
  if (LVar1 == LIST) {
    this = ListValue::GetChildren(value);
    if (((long)(this->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
               super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(this->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
               super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
               super__Vector_impl_data._M_start == 0x40) &&
       (pvVar5 = vector<duckdb::Value,_true>::operator[](this,0), (pvVar5->type_).id_ == VARCHAR)) {
      pvVar5 = vector<duckdb::Value,_true>::operator[](this,0);
      Value::GetValue<std::__cxx11::string>(&local_68,pvVar5);
      iVar4 = ::std::__cxx11::string::compare((char *)&local_68);
      bVar8 = iVar4 == 0;
      bVar9 = true;
    }
    else {
      bVar9 = false;
      bVar8 = false;
    }
    if ((bVar9) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2)) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if (!bVar8) {
      ParseColumnsOrdered(__return_storage_ptr__,this,names,loption);
      goto LAB_00e5fafb;
    }
    local_88._M_dataplus._M_p = (pointer)0x0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a8,
               (long)(names->
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(names->
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5,
               (value_type_conflict1 *)&local_88);
    auVar3 = _DAT_01de8e80;
    if (local_a8._0_8_ != local_a8._8_8_) {
      uVar6 = local_a8._8_8_ + (-8 - local_a8._0_8_);
      auVar10._8_4_ = (int)uVar6;
      auVar10._0_8_ = uVar6;
      auVar10._12_4_ = (int)(uVar6 >> 0x20);
      auVar11._0_8_ = uVar6 >> 3;
      auVar11._8_8_ = auVar10._8_8_ >> 3;
      uVar7 = 0;
      auVar11 = auVar11 ^ _DAT_01de8e80;
      auVar13 = _DAT_01df1070;
      do {
        auVar15 = auVar13 ^ auVar3;
        if ((bool)(~(auVar15._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar15._0_4_ ||
                    auVar11._4_4_ < auVar15._4_4_) & 1)) {
          *(ulong *)(local_a8._0_8_ + uVar7 * 8) = uVar7;
        }
        if ((auVar15._12_4_ != auVar11._12_4_ || auVar15._8_4_ <= auVar11._8_4_) &&
            auVar15._12_4_ <= auVar11._12_4_) {
          *(ulong *)(local_a8._0_8_ + (uVar7 + 1) * 8) = uVar7 + 1;
        }
        uVar7 = uVar7 + 2;
        lVar14 = auVar13._8_8_;
        auVar13._0_8_ = auVar13._0_8_ + 2;
        auVar13._8_8_ = lVar14 + 2;
      } while (((uVar6 >> 3) + 2 & 0xfffffffffffffffe) != uVar7);
    }
  }
  else {
    if (LVar1 == VARCHAR) {
      Value::GetValue<std::__cxx11::string>(&local_68,value);
      iVar4 = ::std::__cxx11::string::compare((char *)&local_68);
      bVar9 = iVar4 == 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
    }
    else {
      bVar9 = false;
    }
    if (!bVar9) {
      this_00 = (BinderException *)__cxa_allocate_exception(0x10);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"\"%s\" expects a column list or * as parameter","");
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      pcVar2 = (loption->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,pcVar2,pcVar2 + loption->_M_string_length);
      BinderException::BinderException<std::__cxx11::string>(this_00,&local_88,&local_48);
      __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_88._M_dataplus._M_p = (pointer)0x0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a8,
               (long)(names->
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(names->
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5,
               (value_type_conflict1 *)&local_88);
    auVar3 = _DAT_01de8e80;
    if (local_a8._0_8_ != local_a8._8_8_) {
      uVar6 = local_a8._8_8_ + (-8 - local_a8._0_8_);
      auVar16._8_4_ = (int)uVar6;
      auVar16._0_8_ = uVar6;
      auVar16._12_4_ = (int)(uVar6 >> 0x20);
      auVar12._0_8_ = uVar6 >> 3;
      auVar12._8_8_ = auVar16._8_8_ >> 3;
      uVar7 = 0;
      auVar12 = auVar12 ^ _DAT_01de8e80;
      auVar15 = _DAT_01df1070;
      do {
        auVar16 = auVar15 ^ auVar3;
        if ((bool)(~(auVar16._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar16._0_4_ ||
                    auVar12._4_4_ < auVar16._4_4_) & 1)) {
          *(ulong *)(local_a8._0_8_ + uVar7 * 8) = uVar7;
        }
        if ((auVar16._12_4_ != auVar12._12_4_ || auVar16._8_4_ <= auVar12._8_4_) &&
            auVar16._12_4_ <= auVar12._12_4_) {
          *(ulong *)(local_a8._0_8_ + (uVar7 + 1) * 8) = uVar7 + 1;
        }
        uVar7 = uVar7 + 2;
        lVar14 = auVar15._8_8_;
        auVar15._0_8_ = auVar15._0_8_ + 2;
        auVar15._8_8_ = lVar14 + 2;
      } while (((uVar6 >> 3) + 2 & 0xfffffffffffffffe) != uVar7);
    }
  }
  (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_a8._0_8_;
  (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_a8._8_8_;
  (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_98;
  local_a8 = (undefined1  [16])0x0;
  local_98 = (pointer)0x0;
LAB_00e5fafb:
  if ((void *)local_a8._0_8_ != (void *)0x0) {
    operator_delete((void *)local_a8._0_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<idx_t> ParseColumnsOrdered(const Value &value, vector<string> &names, const string &loption) {
	vector<idx_t> result;

	// Only accept a list of arguments
	if (value.type().id() != LogicalTypeId::LIST) {
		// Support a single argument if it's '*'
		if (value.type().id() == LogicalTypeId::VARCHAR && value.GetValue<string>() == "*") {
			result.resize(names.size(), 0);
			std::iota(std::begin(result), std::end(result), 0);
			return result;
		}
		throw BinderException("\"%s\" expects a column list or * as parameter", loption);
	}
	auto &children = ListValue::GetChildren(value);
	// accept '*' as single argument
	if (children.size() == 1 && children[0].type().id() == LogicalTypeId::VARCHAR &&
	    children[0].GetValue<string>() == "*") {
		result.resize(names.size(), 0);
		std::iota(std::begin(result), std::end(result), 0);
		return result;
	}
	return ParseColumnsOrdered(children, names, loption);
}